

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

double __thiscall CLOptions::AsDouble(CLOptions *this,string *param_name)

{
  size_type sVar1;
  ostream *poVar2;
  mapped_type *ppCVar3;
  key_type *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  *in_stack_00000020;
  double local_8;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
          ::count(in_RDI,in_RSI);
  if (sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsDouble() :: Parameter \"");
    poVar2 = std::operator<<(poVar2,(string *)in_RSI);
    poVar2 = std::operator<<(poVar2,"\" is not a double!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = 0.0;
  }
  else {
    ppCVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
              ::operator[](in_stack_00000020,(key_type *)this);
    local_8 = CLParam<double>::getValue(&(*ppCVar3)->super_CLParam<double>);
  }
  return local_8;
}

Assistant:

double CLOptions::AsDouble(const std::string& param_name)
{
    if (params_doubles.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsDouble() :: Parameter \"" << param_name << "\" is not a double!" << std::endl;
        return 0 ;
    } else {
        return params_doubles[param_name]->getValue();
    }
}